

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O3

Value * evaluate_infix_expression(Scope *scope,InfixExpression *infix_expression)

{
  Operator operator;
  Expression *expression;
  char *name;
  uint uVar1;
  Variable *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  Value *pVVar5;
  _Bool is_integer_division;
  
  operator = infix_expression->operator;
  uVar1 = operator - ASSIGN_OP >> 1 | (uint)((operator - ASSIGN_OP & 1) != 0) << 0x1f;
  if (uVar1 < 8) {
    expression = infix_expression->left_expression;
    if (expression->expression_type == ExpressionTypeIndexExpression) {
      if (operator == ASSIGN_OP) {
        pVVar3 = (Value *)0x0;
      }
      else {
        pVVar3 = evaluate_expression(scope,expression);
      }
      pVVar5 = evaluate_expression(scope,infix_expression->right_expression);
      pVVar4 = apply_assign_operation(pVVar3,pVVar5,infix_expression->operator);
      pVVar4 = _evaluate_or_apply_index_operation
                         (scope,(IndexExpression *)infix_expression->left_expression,pVVar4);
      free_value(pVVar4);
      if (pVVar3 != (Value *)0x0) {
        free_value(pVVar3);
      }
    }
    else {
      if (expression->expression_type != ExpressionTypeIdentifierExpression) goto LAB_00108490;
      name = *(char **)(expression->literal + 2);
      pVVar2 = scope_get_variable(scope,ValueTypeNullValue,name);
      pVVar3 = new_null_value();
      if (pVVar2 != (Variable *)0x0) {
        pVVar3 = pVVar2->value;
      }
      pVVar5 = evaluate_expression(scope,infix_expression->right_expression);
      pVVar3 = apply_assign_operation(pVVar3,pVVar5,operator);
      scope_set_variable(scope,ValueTypeNullValue,name,pVVar3,0);
    }
    free_value(pVVar5);
LAB_00108490:
    pVVar3 = new_null_value();
    return pVVar3;
  }
  if (uVar1 == 0xc) {
    pVVar3 = evaluate_expression(scope,infix_expression->left_expression);
    pVVar2 = scope_get_variable(scope,pVVar3->value_type,
                                *(char **)(infix_expression->right_expression->literal + 2));
    free_value(pVVar3);
    if (pVVar2 != (Variable *)0x0) {
      pVVar4 = pVVar2->value;
      pVVar4->context_value = pVVar3;
      return pVVar4;
    }
    goto LAB_00108490;
  }
  pVVar3 = evaluate_expression(scope,infix_expression->left_expression);
  pVVar4 = evaluate_expression(scope,infix_expression->right_expression);
  switch(infix_expression->operator) {
  case ADDITION_OP:
    pVVar5 = apply_addition_operation(pVVar3,pVVar4);
    break;
  default:
    pVVar5 = new_null_value();
    break;
  case SUBTRACTION_OP:
    pVVar5 = apply_subtraction_operation(pVVar3,pVVar4);
    break;
  case MULTIPLICATION_OP:
    pVVar5 = apply_multiplication_operation(pVVar3,pVVar4);
    break;
  case DIVISION_OP:
    is_integer_division = false;
    goto LAB_0010854f;
  case INTEGER_DIVISION_OP:
    is_integer_division = true;
LAB_0010854f:
    pVVar5 = apply_division_operation(pVVar3,pVVar4,is_integer_division);
    break;
  case EXPONENT_OP:
    pVVar5 = apply_exponent_operation(pVVar3,pVVar4);
    break;
  case MOD_OP:
    pVVar5 = apply_mod_operation(pVVar3,pVVar4);
    break;
  case CHECK_EQUALITY_OP:
    pVVar5 = apply_check_equality_operation(pVVar3,pVVar4);
    break;
  case CHECK_NOT_EQUALITY_OP:
    pVVar5 = apply_check_not_equality_operation(pVVar3,pVVar4);
    break;
  case CHECK_BIGGER_OP:
    pVVar5 = apply_check_bigger_operation(pVVar3,pVVar4);
    break;
  case CHECK_BIGGER_EQUAL_OP:
    pVVar5 = apply_check_bigger_equal_operation(pVVar3,pVVar4);
    break;
  case CHECK_SMALLER_OP:
    pVVar5 = apply_check_smaller_operation(pVVar3,pVVar4);
    break;
  case CHECK_SMALLER_EQUAL_OP:
    pVVar5 = apply_check_smaller_equal_operation(pVVar3,pVVar4);
    break;
  case RANGE_OP:
    pVVar5 = apply_range_operation(pVVar3,pVVar4);
  }
  free_value(pVVar3);
  free_value(pVVar4);
  return pVVar5;
}

Assistant:

Value *evaluate_infix_expression(Scope *scope, InfixExpression *infix_expression) {
  Value *left_value = NULL, *right_value = NULL, *result_value;

  Operator operator = infix_expression->operator;

  if (operator == ASSIGN_OP ||
    operator == ASSIGN_ADDITION_OP ||
    operator == ASSIGN_SUBTRACTION_OP ||
    operator == ASSIGN_MULTIPLICATION_OP ||
    operator == ASSIGN_DIVISION_OP ||
    operator == ASSIGN_INTEGER_DIVISION_OP ||
    operator == ASSIGN_EXPONENT_OP ||
    operator == ASSIGN_MOD_OP) {

    if (infix_expression->left_expression->expression_type == ExpressionTypeIdentifierExpression) {
      char *identifier = ((StringLiteral *) infix_expression->left_expression->literal)->string_literal;

      Variable *variable = scope_get_variable(scope, ValueTypeNullValue, identifier);

      left_value = new_null_value();

      if (variable != NULL) {
        left_value = variable->value;
      }

      right_value = evaluate_expression(scope, infix_expression->right_expression);
      result_value = apply_assign_operation(left_value, right_value, operator);

      scope_set_variable(scope, ValueTypeNullValue, identifier, result_value, false);

      free_value(right_value);

      return new_null_value();
    }
    else if (infix_expression->left_expression->expression_type == ExpressionTypeIndexExpression) {
      if (infix_expression->operator != ASSIGN_OP) {
        left_value = evaluate_expression(scope, infix_expression->left_expression);
      }

      right_value = evaluate_expression(scope, infix_expression->right_expression);
      result_value = apply_assign_operation(left_value, right_value, infix_expression->operator);

      free_value(apply_index_operation(scope, (IndexExpression *) infix_expression->left_expression, result_value));

      if (left_value != NULL) free_value(left_value);
      free_value(right_value);

      return new_null_value();
    }

    return new_null_value();
  }
  else if (operator == MEMBER_OP) {
    left_value = evaluate_expression(scope, infix_expression->left_expression);

    char *identifier = ((StringLiteral *) infix_expression->right_expression->literal)->string_literal;

    Variable *variable = scope_get_variable(scope, left_value->value_type, identifier);

    free_value(left_value);

    if (variable == NULL) return new_null_value();

    variable->value->context_value = left_value;

    return variable->value;
  }

  left_value = evaluate_expression(scope, infix_expression->left_expression);
  right_value = evaluate_expression(scope, infix_expression->right_expression);

  switch (infix_expression->operator) {
    case ADDITION_OP: {
      result_value = apply_addition_operation(left_value, right_value);
      break;
    }

    case SUBTRACTION_OP: {
      result_value = apply_subtraction_operation(left_value, right_value);
      break;
    }

    case MULTIPLICATION_OP: {
      result_value = apply_multiplication_operation(left_value, right_value);
      break;
    }

    case DIVISION_OP: {
      result_value = apply_division_operation(left_value, right_value, false);
      break;
    }

    case INTEGER_DIVISION_OP: {
      result_value = apply_division_operation(left_value, right_value, true);
      break;
    }

    case EXPONENT_OP: {
      result_value = apply_exponent_operation(left_value, right_value);
      break;
    }

    case MOD_OP: {
      result_value = apply_mod_operation(left_value, right_value);
      break;
    }

    case RANGE_OP: {
      result_value = apply_range_operation(left_value, right_value);
      break;
    }

    case CHECK_EQUALITY_OP: {
      result_value = apply_check_equality_operation(left_value, right_value);
      break;
    }

    case CHECK_NOT_EQUALITY_OP: {
      result_value = apply_check_not_equality_operation(left_value, right_value);
      break;
    }

    case CHECK_BIGGER_OP: {
      result_value = apply_check_bigger_operation(left_value, right_value);
      break;
    }

    case CHECK_BIGGER_EQUAL_OP: {
      result_value = apply_check_bigger_equal_operation(left_value, right_value);
      break;
    }

    case CHECK_SMALLER_OP: {
      result_value = apply_check_smaller_operation(left_value, right_value);
      break;
    }

    case CHECK_SMALLER_EQUAL_OP: {
      result_value = apply_check_smaller_equal_operation(left_value, right_value);
      break;
    }

    default: {
      result_value = new_null_value();
    }
  }

  free_value(left_value);
  free_value(right_value);

  return result_value;
}